

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.h
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::RemoveSource::operator()(RemoveSource *this,NodeId bId)

{
  uint32 uVar1;
  reference pBVar2;
  size_type in_ESI;
  long *in_RDI;
  BodyPtr BVar3;
  NodeId in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffdc;
  
  pBVar2 = bk_lib::
           pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
           ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                         *)(*in_RDI + 0x38),in_ESI);
  uVar1 = pBVar2->lower_or_ext + 1;
  pBVar2->lower_or_ext = uVar1;
  if (uVar1 == 1) {
    pBVar2 = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
             ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                           *)(*in_RDI + 0x38),in_ESI);
    if (((ulong)*pBVar2 & 0x7fffffff) != 0) {
      BVar3 = getBody((DefaultUnfoundedCheck *)*in_RDI,in_stack_ffffffffffffffbc);
      forwardUnsource((DefaultUnfoundedCheck *)BVar3.node,
                      (BodyPtr *)CONCAT44(in_stack_ffffffffffffffdc,BVar3.id),BVar3.node._7_1_);
    }
  }
  return;
}

Assistant:

void operator()(NodeId bId) const {
			if (++self->bodies_[bId].lower_or_ext == 1 && self->bodies_[bId].watches != 0) {
				self->forwardUnsource(self->getBody(bId), addTodo);
			}
		}